

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O1

bool __thiscall Am_Object_Data::operator==(Am_Object_Data *this,Am_Wrapper *test_value)

{
  Am_ID_Tag AVar1;
  int iVar2;
  
  AVar1 = id;
  iVar2 = (**(test_value->super_Am_Registered_Type)._vptr_Am_Registered_Type)(test_value);
  return (Am_Object_Data *)test_value == this && AVar1 == (Am_ID_Tag)iVar2;
}

Assistant:

Am_Object_Data::Am_Object_Data()
    : prototype(nullptr), first_instance(nullptr), next_instance(nullptr),
      first_part(nullptr), next_part(nullptr), default_bits(0x0001),
      bits_mask(0x0000), owner_slot(nullptr, Am_OWNER),
      part_slot(nullptr, Am_NO_SLOT), data(sizeof(Am_Slot_Data *))
{
#ifdef LEAK_TRACE
  std::cout << "ROOT\t\tcreated: " << this << "\tReferences: " << Ref_Count()
            << std::endl;
#endif
#ifdef DEBUG
  Am_Register_Name(this, append_number_to_name("ROOT"));
#endif
  owner_slot.context = this;
  owner_slot.value.wrapper_value = nullptr;
  owner_slot.type = Am_OBJECT;
  default_rule = Am_INHERIT;
  part_slot.value.wrapper_value = this;
  part_slot.type = Am_OBJECT;
  demon_set = new Am_Demon_Set_Data();
  demons_active = DEMONS_ACTIVE;

  // Prevents deallocation due to ref count.
  Note_Reference();
}